

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vwdll.cpp
# Opt level: O1

ssize_t __thiscall memory_io_buf::read_file(memory_io_buf *this,int f,void *buf,size_t nbytes)

{
  pointer __src;
  ulong __n;
  
  __src = (this->data).super__Vector_base<char,_std::allocator<char>_>._M_impl.
          super__Vector_impl_data._M_start + this->readOffset;
  __n = (long)(this->data).super__Vector_base<char,_std::allocator<char>_>._M_impl.
              super__Vector_impl_data._M_finish - (long)__src;
  if (nbytes < __n) {
    __n = nbytes;
  }
  if (__n != 0) {
    memmove(buf,__src,__n);
  }
  this->readOffset = this->readOffset + __n;
  return __n;
}

Assistant:

virtual ssize_t read_file(int f, void* buf, size_t nbytes) {
        nbytes = min(nbytes, data.size()-readOffset);
        copy(data.data()+readOffset, data.data()+readOffset+nbytes, reinterpret_cast<char *>(buf));
        readOffset += nbytes;
        return nbytes;
    }